

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,uchar *memory,char **err)

{
  undefined1 auVar1 [16];
  pointer __src;
  pointer puVar2;
  pointer paVar3;
  int iVar4;
  char *pcVar5;
  uchar *puVar6;
  char **ppcVar7;
  int *piVar8;
  int *piVar9;
  undefined8 uVar10;
  pointer paVar12;
  int c;
  uchar *ptr;
  size_t __n;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrName;
  string attrType;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> customAttribs;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  EXRAttribute attrib;
  int local_148;
  int local_144;
  int local_140;
  int local_13c;
  uint local_12c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_128;
  string local_110;
  float local_f0;
  float local_ec;
  int local_e8;
  int local_e4;
  undefined8 local_e0;
  string local_d8;
  undefined1 local_b8 [16];
  _EXRAttribute *local_a8;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  local_98;
  pointer local_78;
  undefined8 uStack_70;
  undefined1 local_68 [16];
  _EXRAttribute local_50;
  undefined8 uVar11;
  
  if (exrImage == (EXRImage *)0x0 || memory == (uchar *)0x0) {
    iVar14 = -1;
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar5 = "Invalid argument.";
  }
  else if (*(int *)memory == 0x1312f76) {
    if ((((memory[4] == '\x02') && (memory[5] == '\0')) && (memory[6] == '\0')) &&
       (memory[7] == '\0')) {
      local_98.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_98.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_98.
      super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a8 = (_EXRAttribute *)0x0;
      local_b8 = (undefined1  [16])0x0;
      local_68 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      iVar14 = -3;
      local_13c = -1;
      local_f0 = 1.0;
      local_ec = 1.0;
      local_78 = (pointer)0x0;
      uStack_70 = 0;
      local_140 = -1;
      local_144 = -1;
      local_148 = -1;
      local_e4 = -1;
      local_e8 = -1;
      local_e0 = 0;
      local_12c = 0xffffffff;
      ptr = memory + 8;
      do {
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        local_110._M_string_length = 0;
        local_110.field_2._M_local_buf[0] = '\0';
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        local_d8._M_string_length = 0;
        local_d8.field_2._M_local_buf[0] = '\0';
        uVar11 = 0;
        uVar10 = 0;
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        puVar6 = (uchar *)anon_unknown.dwarf_108287::ReadAttribute
                                    (&local_110,&local_d8,&local_128,(char *)ptr);
        if (puVar6 == (uchar *)0x0) {
          puVar6 = ptr + 1;
          iVar4 = 2;
        }
        else {
          iVar4 = std::__cxx11::string::compare((char *)&local_110);
          if (iVar4 == 0) {
            if (*(byte *)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                             *)local_128.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_M_impl).
                          super__Vector_impl_data._M_start < 5) {
              iVar4 = 0;
            }
            else {
              iVar14 = -5;
              iVar4 = 1;
              puVar6 = ptr;
              if (err != (char **)0x0) {
                pcVar5 = "Unsupported compression type.";
LAB_00143b71:
                iVar4 = 1;
                *err = pcVar5;
                puVar6 = ptr;
              }
            }
          }
          else {
            iVar4 = std::__cxx11::string::compare((char *)&local_110);
            if (iVar4 == 0) {
              anon_unknown.dwarf_108287::ReadChannelInfo
                        ((anon_unknown_dwarf_108287 *)&local_98,
                         (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          *)local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              local_12c = (int)((ulong)((long)local_98.
                                              super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_98.
                                             super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                          -0x55555555;
              if ((int)local_12c < 1) {
                iVar14 = -6;
                iVar4 = 1;
                puVar6 = ptr;
                if (err != (char **)0x0) {
                  pcVar5 = "Invalid channels format.";
                  goto LAB_00143b71;
                }
              }
              else {
                iVar4 = 0;
              }
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_110);
              if (iVar4 == 0) {
                uVar13 = (long)local_128.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_128.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                if (uVar13 != 0) {
                  if (uVar13 < 5) {
LAB_00143e1f:
                    uVar10 = 4;
                  }
                  else if (uVar13 < 9) {
LAB_00143e26:
                    uVar10 = 8;
                  }
                  else {
                    if (0xc < uVar13) {
                      local_13c = *(int *)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              *)local_128.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_impl)
                                           .super__Vector_impl_data._M_start;
                      local_140 = *(int *)((long)&(((
                                                  _Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  *)local_128.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_impl).super__Vector_impl_data._M_start + 4);
                      local_144 = *(int *)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              *)local_128.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_impl)
                                           .super__Vector_impl_data._M_finish;
                      local_148 = *(int *)((long)&(((
                                                  _Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  *)local_128.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_impl).super__Vector_impl_data._M_finish + 4);
                      goto LAB_00143c14;
                    }
LAB_00143e2d:
                    uVar10 = 0xc;
                  }
                }
LAB_00143e36:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar10,uVar13);
                goto LAB_00143e47;
              }
              iVar4 = std::__cxx11::string::compare((char *)&local_110);
              uVar10 = uVar11;
              if (iVar4 == 0) {
                uVar13 = (long)local_128.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_128.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                if (uVar13 == 0) goto LAB_00143e36;
                if (uVar13 < 5) goto LAB_00143e1f;
                if (uVar13 < 9) goto LAB_00143e26;
                if (uVar13 < 0xd) goto LAB_00143e2d;
                local_e8 = *(int *)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                       *)local_128.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                    super__Vector_impl_data._M_start;
                local_e4 = *(int *)((long)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                              *)local_128.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->_M_impl)
                                           .super__Vector_impl_data._M_start + 4);
                local_68._8_8_ = 0;
                local_68._0_8_ =
                     (((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        *)local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start)->_M_impl).super__Vector_impl_data.
                     _M_finish;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)&local_110);
                if (iVar4 == 0) {
                  if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start) {
LAB_00143e34:
                    uVar13 = 0;
                    goto LAB_00143e36;
                  }
                  local_e0 = CONCAT71((int7)((ulong)local_128.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start >> 8),
                                      *(undefined1 *)
                                       &(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                           *)local_128.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                        super__Vector_impl_data._M_start);
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)&local_110);
                  if (iVar4 == 0) {
                    if (local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish ==
                        local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start) goto LAB_00143e34;
                    local_ec = *(float *)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                             *)local_128.
                                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                          super__Vector_impl_data._M_start;
                  }
                  else {
                    iVar4 = std::__cxx11::string::compare((char *)&local_110);
                    if (iVar4 == 0) {
                      uVar13 = (long)local_128.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_128.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                      if (uVar13 == 0) goto LAB_00143e36;
                      if (uVar13 < 5) goto LAB_00143e1f;
                      local_78 = (((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                    *)local_128.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_impl).
                                 super__Vector_impl_data._M_start;
                      uStack_70 = 0;
                    }
                    else {
                      iVar4 = std::__cxx11::string::compare((char *)&local_110);
                      if (iVar4 == 0) {
                        if (local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish ==
                            local_128.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start) goto LAB_00143e34;
                        local_f0 = *(float *)&(((_Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                 *)local_128.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_impl).super__Vector_impl_data._M_start;
                      }
                      else {
                        local_50.name = strdup(local_110._M_dataplus._M_p);
                        local_50.type = strdup(local_d8._M_dataplus._M_p);
                        puVar2 = local_128.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish;
                        __src = local_128.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start;
                        local_50.size =
                             (int)((long)local_128.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_128.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                        local_50.value =
                             (uchar *)malloc((long)local_128.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_128.
                                                                                                      
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                        __n = (long)puVar2 - (long)__src;
                        if (__n == 0) {
                          uVar10 = std::__throw_out_of_range_fmt
                                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                              ,0,0);
                          if ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               *)local_128.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start !=
                              (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                               *)0x0) {
                            operator_delete(local_128.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                            operator_delete(local_d8._M_dataplus._M_p);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_110._M_dataplus._M_p != &local_110.field_2) {
                            operator_delete(local_110._M_dataplus._M_p);
                          }
                          if ((void *)local_b8._0_8_ != (void *)0x0) {
                            operator_delete((void *)local_b8._0_8_);
                          }
                          std::
                          vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                          ::~vector(&local_98);
                          _Unwind_Resume(uVar10);
                        }
                        memcpy(local_50.value,__src,__n);
                        if ((_EXRAttribute *)local_b8._8_8_ == local_a8) {
                          std::vector<_EXRAttribute,std::allocator<_EXRAttribute>>::
                          _M_realloc_insert<_EXRAttribute_const&>
                                    ((vector<_EXRAttribute,std::allocator<_EXRAttribute>> *)local_b8
                                     ,(iterator)local_b8._8_8_,&local_50);
                        }
                        else {
                          *(char **)local_b8._8_8_ = local_50.name;
                          *(char **)(local_b8._8_8_ + 8) = local_50.type;
                          *(ulong *)(local_b8._8_8_ + 0x10) =
                               CONCAT44(local_50._20_4_,local_50.size);
                          *(uchar **)(local_b8._8_8_ + 0x18) = local_50.value;
                          local_b8._8_8_ = (_EXRAttribute *)(local_b8._8_8_ + 0x20);
                        }
                      }
                    }
                  }
                }
              }
LAB_00143c14:
              iVar4 = 0;
            }
          }
        }
        if ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             *)local_128.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start !=
            (vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
             *)0x0) {
          operator_delete(local_128.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p);
        }
        ptr = puVar6;
      } while (iVar4 == 0);
      if (iVar4 == 2) {
        if (local_13c < 0) {
LAB_00143e47:
          __assert_fail("dx >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x2b0c,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if (local_140 < 0) {
          __assert_fail("dy >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x2b0d,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if (local_144 < 0) {
          __assert_fail("dw >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x2b0e,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if (local_148 < 0) {
          __assert_fail("dh >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x2b0f,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        if ((int)local_12c < 1) {
          __assert_fail("numChannels >= 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/CGL/include/CGL/tinyexr.h"
                        ,0x2b10,
                        "int ParseMultiChannelEXRHeaderFromMemory(EXRImage *, const unsigned char *, const char **)"
                       );
        }
        uVar15 = (ulong)local_12c;
        ppcVar7 = (char **)malloc(uVar15 * 8);
        exrImage->channel_names = ppcVar7;
        uVar13 = 0;
        paVar3 = local_98.
                 super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        paVar12 = local_98.
                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          pcVar5 = strdup((paVar12->name)._M_dataplus._M_p);
          exrImage->channel_names[uVar13] = pcVar5;
          uVar13 = uVar13 + 1;
          paVar12 = paVar12 + 1;
        } while (uVar15 != uVar13);
        exrImage->num_channels = local_12c;
        exrImage->width = (local_144 - local_13c) + 1;
        exrImage->height = (local_148 - local_140) + 1;
        exrImage->pixel_aspect_ratio = local_ec;
        exrImage->screen_window_width = local_f0;
        exrImage->display_window[0] = local_e8;
        exrImage->display_window[1] = local_e4;
        auVar1._8_8_ = uStack_70;
        auVar1._0_8_ = local_78;
        auVar1 = vunpcklpd_avx(local_68,auVar1);
        *(undefined1 (*) [16])(exrImage->display_window + 2) = auVar1;
        exrImage->data_window[0] = local_13c;
        exrImage->data_window[1] = local_140;
        exrImage->data_window[2] = local_144;
        exrImage->data_window[3] = local_148;
        exrImage->line_order = (uint)(byte)local_e0;
        piVar8 = (int *)malloc(uVar15 * 4);
        exrImage->pixel_types = piVar8;
        piVar9 = &paVar3->pixelType;
        uVar13 = 0;
        do {
          piVar8[uVar13] = *piVar9;
          uVar13 = uVar13 + 1;
          piVar9 = piVar9 + 0xc;
        } while (uVar15 != uVar13);
        piVar9 = (int *)malloc(uVar15 * 4);
        exrImage->requested_pixel_types = piVar9;
        piVar8 = &paVar3->pixelType;
        iVar14 = 0;
        uVar13 = 0;
        do {
          piVar9[uVar13] = *piVar8;
          uVar13 = uVar13 + 1;
          piVar8 = piVar8 + 0xc;
        } while (uVar15 != uVar13);
      }
      if ((void *)local_b8._0_8_ != (void *)0x0) {
        operator_delete((void *)local_b8._0_8_);
      }
      std::
      vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
      ::~vector(&local_98);
      return iVar14;
    }
    iVar14 = -4;
    if (err == (char **)0x0) {
      return -4;
    }
    pcVar5 = "Unsupported version or scanline.";
  }
  else {
    iVar14 = -3;
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar5 = "Header mismatch.";
  }
  *err = pcVar5;
  return iVar14;
}

Assistant:

int ParseMultiChannelEXRHeaderFromMemory(EXRImage *exrImage,
                                         const unsigned char *memory,
                                         const char **err) {
  if (exrImage == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      if (err) {
        (*err) = "Header mismatch.";
      }
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      if (err) {
        (*err) = "Unsupported version or scanline.";
      }
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int numChannels = -1;
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme.
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  float pixelAspectRatio = 1.0f;
  unsigned char lineOrder = 0; // 0 -> increasing y; 1 -> decreasing
  std::vector<ChannelInfo> channels;

  int numCustomAttributes = 0;
  std::vector<EXRAttribute> customAttribs;

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE, 2: ZIPs, 3: ZIP or 4: PIZ
      if (data[0] > 4) {
        if (err) {
          (*err) = "Unsupported compression type.";
        }
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        if (err) {
          (*err) = "Invalid channels format.";
        }
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(lineOrder));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes < TINYEXR_MAX_ATTRIBUTES) {
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        customAttribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  {
    exrImage->channel_names =
        (const char **)malloc(sizeof(const char *) * numChannels);
    for (int c = 0; c < numChannels; c++) {
#ifdef _WIN32
      exrImage->channel_names[c] = _strdup(channels[c].name.c_str());
#else
      exrImage->channel_names[c] = strdup(channels[c].name.c_str());
#endif
    }
    exrImage->num_channels = numChannels;

    exrImage->width = dataWidth;
    exrImage->height = dataHeight;
    exrImage->pixel_aspect_ratio = pixelAspectRatio;
    exrImage->screen_window_center[0] = screenWindowCenter[0];
    exrImage->screen_window_center[1] = screenWindowCenter[1];
    exrImage->screen_window_width = screenWindowWidth;
    exrImage->display_window[0] = displayWindow[0];
    exrImage->display_window[1] = displayWindow[1];
    exrImage->display_window[2] = displayWindow[2];
    exrImage->display_window[3] = displayWindow[3];
    exrImage->data_window[0] = dx;
    exrImage->data_window[1] = dy;
    exrImage->data_window[2] = dw;
    exrImage->data_window[3] = dh;
    exrImage->line_order = lineOrder;

    exrImage->pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->pixel_types[c] = channels[c].pixelType;
    }

    // Initially fill with values of `pixel-types`
    exrImage->requested_pixel_types = (int *)malloc(sizeof(int) * numChannels);
    for (int c = 0; c < numChannels; c++) {
      exrImage->requested_pixel_types[c] = channels[c].pixelType;
    }
  }

  if (numCustomAttributes > 0) {
    assert(customAttribs.size() < TINYEXR_MAX_ATTRIBUTES);
    exrImage->num_custom_attributes = numCustomAttributes;

    for (int i = 0; i < (int)customAttribs.size(); i++) {
      exrImage->custom_attributes[i] = customAttribs[i];
    }
  } 

  return 0; // OK
}